

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int LTnum(TValue *l,TValue *r)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  lua_Number lVar11;
  
  uVar2 = l->tt_;
  if (((uVar2 & 0xf) != 3) || (uVar3 = r->tt_, (uVar3 & 0xf) != 3)) {
    __assert_fail("(((((((l))->tt_)) & 0x0F)) == (3)) && (((((((r))->tt_)) & 0x0F)) == (3))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x286,"int LTnum(const TValue *, const TValue *)");
  }
  if (uVar2 == 3) {
    dVar1 = (l->value_).n;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    if (uVar3 == 0x13) {
      lVar4 = (r->value_).i;
      if (0x40000000000000 < lVar4 + 0x20000000000000U) {
        auVar9 = vroundsd_avx(auVar9,auVar9,9);
        dVar8 = auVar9._0_8_;
        bVar7 = (long)dVar8 < lVar4;
        bVar6 = 0.0 < dVar1;
        goto LAB_0012985b;
      }
      lVar11 = (lua_Number)lVar4;
    }
    else {
      if (uVar3 != 3) {
        __assert_fail("((((r))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x293,"int LTnum(const TValue *, const TValue *)");
      }
      lVar11 = (r->value_).n;
    }
    bVar7 = lVar11 == dVar1;
    bVar6 = lVar11 < dVar1;
  }
  else {
    if (uVar2 != 0x13) {
      __assert_fail("((((l))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x28f,"int LTnum(const TValue *, const TValue *)");
    }
    lVar4 = (l->value_).i;
    if (uVar3 != 3) {
      if (uVar3 != 0x13) {
        __assert_fail("((((r))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x28c,"int LTnum(const TValue *, const TValue *)");
      }
      bVar7 = lVar4 < (r->value_).i;
      goto LAB_00129878;
    }
    dVar1 = (r->value_).n;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    if (0x40000000000000 < lVar4 + 0x20000000000000U) {
      auVar9 = vroundsd_avx(auVar10,auVar10,9);
      uVar5 = vcmpsd_avx512f(auVar9,auVar10,4);
      bVar7 = (bool)((byte)uVar5 & 1);
      dVar8 = (double)((ulong)bVar7 * (long)(auVar9._0_8_ + 1.0) +
                      (ulong)!bVar7 * (long)auVar9._0_8_);
      bVar7 = lVar4 < (long)dVar8;
      bVar6 = dVar1 < 0.0;
LAB_0012985b:
      bVar6 = !bVar6 && dVar1 != 0.0;
      if (9.223372036854776e+18 <= dVar8) {
        bVar7 = bVar6;
      }
      if (dVar8 < -9.223372036854776e+18) {
        bVar7 = bVar6;
      }
      goto LAB_00129878;
    }
    bVar7 = dVar1 == (double)lVar4;
    bVar6 = dVar1 < (double)lVar4;
  }
  bVar7 = !bVar6 && !bVar7;
LAB_00129878:
  return (int)bVar7;
}

Assistant:

static int LTnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li < ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LTintfloat(li, fltvalue(r));  /* l < r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numlt(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LTfloatint(lf, ivalue(r));
  }
}